

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xheaders.cc
# Opt level: O2

string * __thiscall iqxmlrpc::XHeaders::operator[](XHeaders *this,string *v)

{
  bool bVar1;
  mapped_type *pmVar2;
  Error_xheader *this_00;
  locale local_40;
  string key;
  
  bVar1 = validate(v);
  if (bVar1) {
    std::__cxx11::string::string((string *)&key,(string *)v);
    std::locale::locale(&local_40);
    boost::algorithm::to_lower<std::__cxx11::string>(&key,&local_40);
    std::locale::~locale(&local_40);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->xheaders_,&key);
    std::__cxx11::string::~string((string *)&key);
    return pmVar2;
  }
  this_00 = (Error_xheader *)__cxa_allocate_exception(0x10);
  Error_xheader::Error_xheader(this_00,"The header doesn\'t starts with `X-`");
  __cxa_throw(this_00,&Error_xheader::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::string& XHeaders::operator[] (const std::string& v) {
  if (!validate(v)) {
    throw Error_xheader("The header doesn't starts with `X-`");
  }
  std::string key(v);
  boost::to_lower(key);
  return xheaders_[key];
}